

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O1

string * bgui::(anonymous_namespace)::createHelpText_abi_cxx11_(void)

{
  string *in_RDI;
  ostringstream out;
  ostringstream aoStack_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"Usage and Keycodes:\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"left mouse click and moving for panning\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,
             "right mouse click (or shift and left mouse click) for pixel information\n",0x48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"mouse wheel for zooming\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"Information and Exit:\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"\'h\'            Shows this help text.\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"\'v\'            Shows version information.\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,
             "\'i\'            Shows information about the currently viewed image part.\n",0x48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"\'q\', \'esc\'     Exit\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"Select color channel:\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"\'C\'            Reset color channel selection.\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,
             "\'R\', \'G\', \'B\'  Shows only the corresponding color channel.\n",0x3b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"Size and Orientation:\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"\'0\'            (Re)set zoom factor to 1.\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"\'+\', \'-\'       Zooming in and out.\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,
             "\'s\'            Resize window to size of image at current scaling\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,
             "\'r\', \'l\'       Rotate anti-clockwise or clockwise by 90 degrees\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"\'f\'            Flip image horizontally.\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"Radiometry:\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,
             "\'t\'            Switches smoothing by trilinear filtering on or off.\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,
             "\'a\'            Scale such that currently visible part of the image uses full contrast\n"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,
             "\'b\', \'w\'       Scale such that pixel at current mouse position is black or white\n"
             ,0x51);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,
             "\'m\'            Switching between raw, jet and rainbow mapping for greyscale images\n"
             ,0x53);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,
             "\'1\', \'2\', \'4\'  Setting the corresponding value as gamma factor\n",0x3f);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  std::ios_base::~ios_base(local_118);
  return in_RDI;
}

Assistant:

std::string createHelpText()
{
  std::ostringstream out;

  out << "Usage and Keycodes:\n";
  out << "\n";
  out << "left mouse click and moving for panning\n";
  out << "right mouse click (or shift and left mouse click) for pixel information\n";
  out << "mouse wheel for zooming\n";
  out << "\n";
  out << "Information and Exit:\n";
  out << "'h'            Shows this help text.\n";
  out << "'v'            Shows version information.\n";
  out << "'i'            Shows information about the currently viewed image part.\n";
  out << "'q', 'esc'     Exit\n";
  out << "\n";
  out << "Select color channel:\n";
  out << "'C'            Reset color channel selection.\n";
  out << "'R', 'G', 'B'  Shows only the corresponding color channel.\n";
  out << "\n";
  out << "Size and Orientation:\n";
  out << "'0'            (Re)set zoom factor to 1.\n";
  out << "'+', '-'       Zooming in and out.\n";
  out << "'s'            Resize window to size of image at current scaling\n";
  out << "'r', 'l'       Rotate anti-clockwise or clockwise by 90 degrees\n";
  out << "'f'            Flip image horizontally.\n";
  out << "\n";
  out << "Radiometry:\n";
  out << "'t'            Switches smoothing by trilinear filtering on or off.\n";
  out << "'a'            Scale such that currently visible part of the image uses full contrast\n";
  out << "'b', 'w'       Scale such that pixel at current mouse position is black or white\n";
  out << "'m'            Switching between raw, jet and rainbow mapping for greyscale images\n";
  out << "'1', '2', '4'  Setting the corresponding value as gamma factor\n";

  return out.str();
}